

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
          (SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin> *this,DebugWriter *w
          ,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_0145949d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",5);
  }
  DebugWriter::Print(w,
                     L"SyncToLiteralAndConsumeInstT<Char2LiteralScannerMixin> aka SyncToChar2LiteralAndConsume"
                    );
  DebugWriter::Print(w,L"(");
  Char2LiteralScannerMixin::Print(&this->super_Char2LiteralScannerMixin,w,litbuf_00);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_0145949d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::Char2LiteralScannerMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Char2LiteralScannerMixin,
               L"Char2LiteralScannerMixin");
    DebugWriter::Unindent(w);
  }
  return 5;
}

Assistant:

int SyncToLiteralAndConsumeInstT<Char2LiteralScannerMixin>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        // NOTE: this text is unique to this instantiation
        PRINT_RE_BYTECODE_BEGIN("SyncToLiteralAndConsumeInstT<Char2LiteralScannerMixin> aka SyncToChar2LiteralAndConsume");
        PRINT_MIXIN(Char2LiteralScannerMixin); // NOTE: would work with template <typename ScannerT> ScannerT::Print
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(Char2LiteralScannerMixin); // NOTE: unique because macro expansion and _u(#InstType) happen before template is evaluated (so text would be ScannerT)
        PRINT_RE_BYTECODE_END();
    }